

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O3

void lts2::SoftThresholding(Mat *src,Mat *thresholdedCoeffs,float threshold)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  Mat tmp;
  undefined8 local_370;
  Mat local_368 [16];
  long local_358;
  long *local_320;
  double local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  Mat local_2e8 [16];
  Mat local_2d8 [96];
  Mat local_278 [96];
  Mat aMStack_218 [144];
  long *local_188 [2];
  Mat local_178 [96];
  Mat local_118 [96];
  Mat aMStack_b8 [144];
  
  cv::Mat::Mat(local_368);
  cv::abs(local_2e8);
  local_308 = (double)threshold;
  local_300 = 0;
  uStack_2f8 = 0;
  local_2f0 = 0;
  cv::operator-((MatExpr *)local_188,(Scalar_ *)local_2e8);
  (**(code **)(*local_188[0] + 0x18))(local_188[0],local_188,local_368,0xffffffff);
  cv::Mat::~Mat(aMStack_b8);
  cv::Mat::~Mat(local_118);
  cv::Mat::~Mat(local_178);
  cv::Mat::~Mat(aMStack_218);
  cv::Mat::~Mat(local_278);
  cv::Mat::~Mat(local_2d8);
  local_370 = CONCAT44((int)**(undefined8 **)(src + 0x40),
                       (int)((ulong)**(undefined8 **)(src + 0x40) >> 0x20));
  cv::Mat::create(thresholdedCoeffs,&local_370,5);
  iVar2 = *(int *)(src + 8);
  if (0 < (long)iVar2) {
    lVar7 = *(long *)(src + 0x10);
    lVar4 = **(long **)(src + 0x48);
    lVar5 = *local_320;
    lVar9 = *(long *)(thresholdedCoeffs + 0x10);
    lVar6 = **(long **)(thresholdedCoeffs + 0x48);
    iVar3 = *(int *)(src + 0xc);
    lVar10 = 0;
    do {
      if (0 < iVar3) {
        lVar8 = 0;
        do {
          fVar1 = *(float *)(local_358 + lVar8 * 4);
          uVar11 = 0;
          if (0.0 < fVar1) {
            uVar11 = -(uint)(0.0 < *(float *)(lVar7 + lVar8 * 4));
            uVar11 = ~uVar11 & (uint)-fVar1 | uVar11 & (uint)fVar1;
          }
          *(uint *)(lVar9 + lVar8 * 4) = uVar11;
          lVar8 = lVar8 + 1;
        } while (iVar3 != (int)lVar8);
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + lVar6;
      local_358 = local_358 + lVar5;
      lVar7 = lVar7 + lVar4;
    } while (lVar10 != iVar2);
  }
  cv::Mat::~Mat(local_368);
  return;
}

Assistant:

void lts2::SoftThresholding(const cv::Mat &src, cv::Mat &thresholdedCoeffs, float threshold)
{
  cv::Mat tmp;
  tmp = cv::abs(src) - threshold;
    
  thresholdedCoeffs.create(src.size(), CV_32F);
    
  for (int y = 0; y < src.rows; ++y)
  {
    const float *p_src = src.ptr<float>(y);
    const float *p_tsrc = tmp.ptr<float>(y);
    float *p_th = thresholdedCoeffs.ptr<float>(y);
        
    for (int x = 0; x < src.cols; ++x, ++p_tsrc, ++p_src)
    {
      if (*p_tsrc <= 0.0f)
        *p_th++ = 0.0f;
      else
      {
        float sign = (*p_src > 0.0f) ? 1.0f: -1.0f;
        *p_th++ = sign * *p_tsrc;
      }
    }
  }
}